

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDComponentFilter::AcceptEdge(ON_SubDComponentFilter *this,ON_SubDEdge *e)

{
  bool bVar1;
  ON_SubDEdge *e_local;
  ON_SubDComponentFilter *this_local;
  
  if ((this->m_bRejectEdges & 1U) == 0) {
    if (e == (ON_SubDEdge *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = AcceptEdgeTag(this,e->m_edge_tag);
      if (bVar1) {
        if (this->m_edge_topology_filter != Unset) {
          if (e->m_face_count == 1) {
            if ((this->m_edge_topology_filter & Boundary) == Unset) {
              return false;
            }
          }
          else if (e->m_face_count == 2) {
            if ((this->m_edge_topology_filter & Interior) == Unset) {
              return false;
            }
          }
          else if ((this->m_edge_topology_filter & Nonmanifold) == Unset) {
            return false;
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDComponentFilter::AcceptEdge(const ON_SubDEdge * e) const
{
  if (m_bRejectEdges)
    return false;

  if (nullptr == e)
    return false;

  if (false == AcceptEdgeTag(e->m_edge_tag))
    return false;

  if (ON_SubDComponentFilter::Topology::Unset != m_edge_topology_filter)
  {
    // check boundary/interior/nonmanifold
    if (1 == e->m_face_count)
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Boundary)& static_cast<unsigned char>(m_edge_topology_filter)))
        return false;
    }
    else if (2 == e->m_face_count)
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Interior)& static_cast<unsigned char>(m_edge_topology_filter)))
        return false;
    }
    else
    {
      if (0 == (static_cast<unsigned char>(ON_SubDComponentFilter::Topology::Nonmanifold)& static_cast<unsigned char>(m_edge_topology_filter)))
        return false;
    }
  }

  return true;
}